

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

RGB __thiscall
pbrt::PixelSensor::ToSensorRGB(PixelSensor *this,SampledSpectrum *s,SampledWavelengths *lambda)

{
  RGB RVar1;
  Float r;
  Float g;
  Float b;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  SampledSpectrum SVar16;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  SampledSpectrum *in_stack_ffffffffffffff68;
  SampledWavelengths *in_stack_ffffffffffffff78;
  DenselySampledSpectrum *in_stack_ffffffffffffff80;
  RGB local_c;
  
  auVar15 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  SVar16 = DenselySampledSpectrum::Sample(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  auVar9._0_8_ = SVar16.values.values._8_8_;
  auVar9._8_56_ = auVar15;
  auVar2._0_8_ = SVar16.values.values._0_8_;
  auVar2._8_56_ = auVar8;
  vmovlpd_avx(auVar2._0_16_);
  vmovlpd_avx(auVar9._0_16_);
  SVar16 = SampledSpectrum::operator*
                     (in_stack_ffffffffffffff68,
                      (SampledSpectrum *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  auVar10._0_8_ = SVar16.values.values._8_8_;
  auVar10._8_56_ = auVar15;
  auVar3._0_8_ = SVar16.values.values._0_8_;
  auVar3._8_56_ = auVar8;
  vmovlpd_avx(auVar3._0_16_);
  vmovlpd_avx(auVar10._0_16_);
  r = SampledSpectrum::Average
                ((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  auVar8 = extraout_var;
  SVar16 = DenselySampledSpectrum::Sample(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  auVar11._0_8_ = SVar16.values.values._8_8_;
  auVar11._8_56_ = auVar15;
  auVar4._0_8_ = SVar16.values.values._0_8_;
  auVar4._8_56_ = auVar8;
  vmovlpd_avx(auVar4._0_16_);
  vmovlpd_avx(auVar11._0_16_);
  SVar16 = SampledSpectrum::operator*
                     (in_stack_ffffffffffffff68,
                      (SampledSpectrum *)CONCAT44(r,in_stack_ffffffffffffff60));
  auVar12._0_8_ = SVar16.values.values._8_8_;
  auVar12._8_56_ = auVar15;
  auVar5._0_8_ = SVar16.values.values._0_8_;
  auVar5._8_56_ = auVar8;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar12._0_16_);
  g = SampledSpectrum::Average((SampledSpectrum *)CONCAT44(r,in_stack_ffffffffffffff60));
  auVar8 = extraout_var_00;
  SVar16 = DenselySampledSpectrum::Sample(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  auVar13._0_8_ = SVar16.values.values._8_8_;
  auVar13._8_56_ = auVar15;
  auVar6._0_8_ = SVar16.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  vmovlpd_avx(auVar6._0_16_);
  vmovlpd_avx(auVar13._0_16_);
  SVar16 = SampledSpectrum::operator*(in_stack_ffffffffffffff68,(SampledSpectrum *)CONCAT44(r,g));
  auVar14._0_8_ = SVar16.values.values._8_8_;
  auVar14._8_56_ = auVar15;
  auVar7._0_8_ = SVar16.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar14._0_16_);
  b = SampledSpectrum::Average((SampledSpectrum *)CONCAT44(r,g));
  RGB::RGB(&local_c,r,g,b);
  RVar1.b = local_c.b;
  RVar1.r = local_c.r;
  RVar1.g = local_c.g;
  return RVar1;
}

Assistant:

PBRT_CPU_GPU
    RGB ToSensorRGB(const SampledSpectrum &s, const SampledWavelengths &lambda) const {
        return RGB((r_bar.Sample(lambda) * s).Average(),
                      (g_bar.Sample(lambda) * s).Average(),
                      (b_bar.Sample(lambda) * s).Average());
    }